

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_zip_zip64.c
# Opt level: O0

void test_read_format_zip_zip64a(void)

{
  char *buff;
  archive *paVar1;
  size_t s;
  char *p;
  archive *a;
  char *refname;
  char *in_stack_000003f0;
  void *in_stack_ffffffffffffffd8;
  archive *paVar2;
  char *in_stack_ffffffffffffffe0;
  char *fmt;
  
  fmt = "test_read_format_zip_zip64a.zip";
  extract_reference_file(in_stack_000003f0);
  buff = slurpfile((size_t *)&stack0xffffffffffffffe0,fmt);
  paVar1 = archive_read_new();
  assertion_assert((char *)paVar1,(wchar_t)((ulong)buff >> 0x20),(wchar_t)buff,
                   in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  archive_read_support_format_zip_seekable(a);
  paVar2 = paVar1;
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar1 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar1,(char *)0x1c3c7c,p);
  read_open_memory_seek(paVar2,buff,(size_t)in_stack_ffffffffffffffe0,(size_t)paVar1);
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar2 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar2,(char *)0x1c3cc4,p);
  verify_file0_seek((archive *)p);
  paVar1 = archive_read_new();
  assertion_assert((char *)paVar1,(wchar_t)((ulong)buff >> 0x20),(wchar_t)buff,
                   in_stack_ffffffffffffffe0,paVar2);
  archive_read_support_format_zip_streamable(a);
  paVar2 = paVar1;
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar1 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar1,(char *)0x1c3d3a,p);
  read_open_memory_seek(paVar2,buff,(size_t)in_stack_ffffffffffffffe0,(size_t)paVar1);
  assertion_equal_int(fmt,(wchar_t)((ulong)paVar2 >> 0x20),(longlong)buff,in_stack_ffffffffffffffe0,
                      (longlong)paVar2,(char *)0x1c3d82,p);
  verify_file0_stream((archive *)p,s._4_4_);
  free(buff);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_zip_zip64a)
{
	const char *refname = "test_read_format_zip_zip64a.zip";
	struct archive *a;
	char *p;
	size_t s;

	extract_reference_file(refname);
	p = slurpfile(&s, refname);

	/* First read with seeking. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip_seekable(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, p, s, 1));
	verify_file0_seek(a);

	/* Then read streaming. */
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_zip_streamable(a));
	assertEqualIntA(a, ARCHIVE_OK, read_open_memory_seek(a, p, s, 1));
	verify_file0_stream(a, 0);
	free(p);
}